

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void array_bitset_container_andnot
               (array_container_t *src_1,bitset_container_t *src_2,array_container_t *dst)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  uint64_t *puVar4;
  uint min;
  uint uVar5;
  ulong uVar6;
  
  min = src_1->cardinality;
  if (dst->capacity < (int)min) {
    array_container_grow(dst,min,false);
    min = src_1->cardinality;
  }
  if ((int)min < 1) {
    uVar5 = 0;
  }
  else {
    puVar2 = src_1->array;
    puVar3 = dst->array;
    puVar4 = src_2->words;
    uVar6 = 0;
    uVar5 = 0;
    do {
      uVar1 = puVar2[uVar6];
      puVar3[uVar5] = uVar1;
      uVar5 = (uVar5 + 1) - (uint)((puVar4[uVar1 >> 6] >> ((ulong)uVar1 & 0x3f) & 1) != 0);
      uVar6 = uVar6 + 1;
    } while (min != uVar6);
  }
  dst->cardinality = uVar5;
  return;
}

Assistant:

void array_bitset_container_andnot(const array_container_t *src_1,
                                   const bitset_container_t *src_2,
                                   array_container_t *dst) {
    // follows Java implementation as of June 2016
    if (dst->capacity < src_1->cardinality) {
        array_container_grow(dst, src_1->cardinality, false);
    }
    int32_t newcard = 0;
    const int32_t origcard = src_1->cardinality;
    for (int i = 0; i < origcard; ++i) {
        uint16_t key = src_1->array[i];
        dst->array[newcard] = key;
        newcard += 1 - bitset_container_contains(src_2, key);
    }
    dst->cardinality = newcard;
}